

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_api.c
# Opt level: O3

MPP_RET hal_avsd_deinit(void *decoder)

{
  MPP_RET MVar1;
  undefined8 uVar2;
  
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_api","In.","hal_avsd_deinit");
  }
  if (decoder != (void *)0x0) {
    MVar1 = (**(code **)((long)decoder + 0x20))(decoder);
    if (MVar1 < MPP_OK) {
      if (((byte)avsd_hal_debug & 4) == 0) {
        return MVar1;
      }
      uVar2 = 0x7b;
    }
    else {
      if ((*(MppDev *)((long)decoder + 0x80) != (MppDev)0x0) &&
         (MVar1 = mpp_dev_deinit(*(MppDev *)((long)decoder + 0x80)), MVar1 != MPP_OK)) {
        _mpp_log_l(2,"hal_avsd_api","mpp_dev_deinit failed. ret: %d\n",(char *)0x0,
                   (ulong)(uint)MVar1);
      }
      if ((*(MppBufferGroup *)((long)decoder + 0x68) == (MppBufferGroup)0x0) ||
         (MVar1 = mpp_buffer_group_put(*(MppBufferGroup *)((long)decoder + 0x68)), MPP_NOK < MVar1))
      goto LAB_001df7b9;
      if (((byte)avsd_hal_debug & 4) == 0) {
        return MVar1;
      }
      uVar2 = 0x84;
    }
    _mpp_log_l(4,"hal_avsd_api","Function error(%d).\n",(char *)0x0,uVar2);
    return MVar1;
  }
  if (((byte)avsd_hal_debug & 4) != 0) {
    _mpp_log_l(4,"hal_avsd_api","input empty(%d).\n",(char *)0x0,0x79);
  }
LAB_001df7b9:
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_api","Out.","hal_avsd_deinit");
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_deinit(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == decoder);

    FUN_CHECK(ret = p_hal->hal_api.deinit(decoder));
    //!< mpp_dev_init
    if (p_hal->dev) {
        ret = mpp_dev_deinit(p_hal->dev);
        if (ret)
            mpp_err("mpp_dev_deinit failed. ret: %d\n", ret);
    }

    if (p_hal->buf_group) {
        FUN_CHECK(ret = mpp_buffer_group_put(p_hal->buf_group));
    }
__RETURN:
    AVSD_HAL_TRACE("Out.");

    return ret = MPP_OK;
__FAILED:
    return ret;
}